

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O0

bool __thiscall beast::SemanticVersion::parse(SemanticVersion *this,string *input)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined4 local_b0;
  allocator<char> local_99;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_88 [8];
  string version;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  iterator_type right_iter;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  left_iter;
  string *input_local;
  SemanticVersion *this_local;
  
  left_iter._M_current = (char *)input;
  uVar4 = std::__cxx11::string::begin();
  uVar5 = std::__cxx11::string::end();
  local_28 = std::
             find_if_not<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,beast::SemanticVersion::parse(std::__cxx11::string_const&)::__0>
                       (uVar4,uVar5);
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::
  find_if_not<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,beast::SemanticVersion::parse(std::__cxx11::string_const&)::__1>
            (&local_50,local_58,local_60);
  local_48._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_50);
  bVar1 = __gnu_cxx::operator>=(&local_28,&local_48);
  if (bVar1) {
    return false;
  }
  local_90._M_current = local_28._M_current;
  local_98._M_current = local_48._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)local_88,local_90,local_98,&local_99);
  std::allocator<char>::~allocator(&local_99);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)left_iter._M_current);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    iVar3 = std::numeric_limits<int>::max();
    bVar1 = chopUInt(&this->majorVersion,iVar3,(string *)local_88);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,".",&local_d1);
      bVar1 = chop(&local_d0,(string *)local_88);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        iVar3 = std::numeric_limits<int>::max();
        bVar1 = chopUInt(&this->minorVersion,iVar3,(string *)local_88);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_f8,".",&local_f9);
          bVar1 = chop(&local_f8,(string *)local_88);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            iVar3 = std::numeric_limits<int>::max();
            bVar1 = chopUInt(&this->patchVersion,iVar3,(string *)local_88);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_120,"-",&local_121);
              bVar1 = chop(&local_120,(string *)local_88);
              std::__cxx11::string::~string((string *)&local_120);
              std::allocator<char>::~allocator((allocator<char> *)&local_121);
              if (bVar1) {
                bVar1 = extract_identifiers(&this->preReleaseIdentifiers,false,(string *)local_88);
                if (!bVar1) {
                  this_local._7_1_ = false;
                  goto LAB_0030ac75;
                }
                bVar1 = unit_test::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&this->preReleaseIdentifiers);
                if (bVar1) {
                  this_local._7_1_ = false;
                  goto LAB_0030ac75;
                }
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_148,"+",&local_149);
              bVar1 = chop(&local_148,(string *)local_88);
              std::__cxx11::string::~string((string *)&local_148);
              std::allocator<char>::~allocator((allocator<char> *)&local_149);
              if (bVar1) {
                bVar1 = extract_identifiers(&this->metaData,true,(string *)local_88);
                if (!bVar1) {
                  this_local._7_1_ = false;
                  goto LAB_0030ac75;
                }
                bVar1 = unit_test::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&this->metaData);
                if (bVar1) {
                  this_local._7_1_ = false;
                  goto LAB_0030ac75;
                }
              }
              bVar2 = std::__cxx11::string::empty();
              this_local._7_1_ = (bool)(bVar2 & 1);
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
LAB_0030ac75:
  local_b0 = 1;
  std::__cxx11::string::~string((string *)local_88);
  return this_local._7_1_;
}

Assistant:

bool SemanticVersion::parse (std::string const& input)
{
    // May not have leading or trailing whitespace
    auto left_iter = std::find_if_not (input.begin (), input.end (),
        [](std::string::value_type c)
        {
            return std::isspace (c, std::locale::classic());
        });

    auto right_iter = std::find_if_not (input.rbegin (), input.rend (),
        [](std::string::value_type c)
        {
            return std::isspace (c, std::locale::classic());
        }).base ();

    // Must not be empty!
    if (left_iter >= right_iter)
        return false;

    std::string version (left_iter, right_iter);

    // May not have leading or trailing whitespace
    if (version != input)
        return false;

    // Must have major version number
    if (! chopUInt (majorVersion, std::numeric_limits <int>::max (), version))
        return false;
    if (! chop (".", version))
        return false;

    // Must have minor version number
    if (! chopUInt (minorVersion, std::numeric_limits <int>::max (), version))
        return false;
    if (! chop (".", version))
        return false;

    // Must have patch version number
    if (! chopUInt (patchVersion, std::numeric_limits <int>::max (), version))
        return false;

    // May have pre-release identifier list
    if (chop ("-", version))
    {
        if (!extract_identifiers (preReleaseIdentifiers, false, version))
            return false;

        // Must not be empty
        if (preReleaseIdentifiers.empty ())
            return false;
    }

    // May have metadata identifier list
    if (chop ("+", version))
    {
        if (!extract_identifiers (metaData, true, version))
            return false;

        // Must not be empty
        if (metaData.empty ())
            return false;
    }

    return version.empty ();
}